

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O0

uint32_t pbrt::MultiplyGenerator(span<const_unsigned_int> C,uint32_t a)

{
  uint *puVar1;
  uint in_EDX;
  int i;
  uint32_t v;
  int local_1c;
  uint local_18;
  uint local_14;
  span<const_unsigned_int> local_10;
  
  local_18 = 0;
  local_1c = 0;
  for (local_14 = in_EDX; local_14 != 0; local_14 = local_14 >> 1) {
    if ((local_14 & 1) != 0) {
      puVar1 = pstd::span<const_unsigned_int>::operator[](&local_10,(long)local_1c);
      local_18 = *puVar1 ^ local_18;
    }
    local_1c = local_1c + 1;
  }
  return local_18;
}

Assistant:

PBRT_CPU_GPU inline uint32_t MultiplyGenerator(pstd::span<const uint32_t> C, uint32_t a) {
    uint32_t v = 0;
    for (int i = 0; a != 0; ++i, a >>= 1)
        if (a & 1)
            v ^= C[i];
    return v;
}